

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zonemeta.cpp
# Opt level: O0

UDate icu_63::parseDate(UChar *text,UErrorCode *status)

{
  UBool UVar1;
  int32_t iVar2;
  bool bVar3;
  double dVar4;
  int local_70;
  int local_68;
  int local_60;
  int local_58;
  int local_50;
  UDate date;
  int32_t idx;
  int32_t n;
  int32_t min;
  int32_t hour;
  int32_t day;
  int32_t month;
  int32_t year;
  int32_t len;
  UErrorCode *status_local;
  UChar *text_local;
  
  UVar1 = ::U_FAILURE(*status);
  if (UVar1 == '\0') {
    iVar2 = u_strlen_63(text);
    if ((iVar2 == 0x10) || (iVar2 == 10)) {
      day = 0;
      hour = 0;
      min = 0;
      n = 0;
      idx = 0;
      date._0_4_ = 0;
      while( true ) {
        bVar3 = false;
        if (date._0_4_ < 4) {
          UVar1 = ::U_SUCCESS(*status);
          bVar3 = UVar1 != '\0';
        }
        if (!bVar3) break;
        if (((ushort)text[date._0_4_] < 0x30) || (0x39 < (ushort)text[date._0_4_])) {
          local_50 = -1;
        }
        else {
          local_50 = (ushort)text[date._0_4_] - 0x30;
        }
        if (local_50 < 0) {
          *status = U_INVALID_FORMAT_ERROR;
        }
        else {
          day = day * 10 + local_50;
        }
        date._0_4_ = date._0_4_ + 1;
      }
      date._0_4_ = 5;
      while( true ) {
        bVar3 = false;
        if (date._0_4_ < 7) {
          UVar1 = ::U_SUCCESS(*status);
          bVar3 = UVar1 != '\0';
        }
        if (!bVar3) break;
        if (((ushort)text[date._0_4_] < 0x30) || (0x39 < (ushort)text[date._0_4_])) {
          local_58 = -1;
        }
        else {
          local_58 = (ushort)text[date._0_4_] - 0x30;
        }
        if (local_58 < 0) {
          *status = U_INVALID_FORMAT_ERROR;
        }
        else {
          hour = hour * 10 + local_58;
        }
        date._0_4_ = date._0_4_ + 1;
      }
      date._0_4_ = 8;
      while( true ) {
        bVar3 = false;
        if (date._0_4_ < 10) {
          UVar1 = ::U_SUCCESS(*status);
          bVar3 = UVar1 != '\0';
        }
        if (!bVar3) break;
        if (((ushort)text[date._0_4_] < 0x30) || (0x39 < (ushort)text[date._0_4_])) {
          local_60 = -1;
        }
        else {
          local_60 = (ushort)text[date._0_4_] - 0x30;
        }
        if (local_60 < 0) {
          *status = U_INVALID_FORMAT_ERROR;
        }
        else {
          min = min * 10 + local_60;
        }
        date._0_4_ = date._0_4_ + 1;
      }
      if (iVar2 == 0x10) {
        date._0_4_ = 0xb;
        while( true ) {
          bVar3 = false;
          if (date._0_4_ < 0xd) {
            UVar1 = ::U_SUCCESS(*status);
            bVar3 = UVar1 != '\0';
          }
          if (!bVar3) break;
          if (((ushort)text[date._0_4_] < 0x30) || (0x39 < (ushort)text[date._0_4_])) {
            local_68 = -1;
          }
          else {
            local_68 = (ushort)text[date._0_4_] - 0x30;
          }
          if (local_68 < 0) {
            *status = U_INVALID_FORMAT_ERROR;
          }
          else {
            n = n * 10 + local_68;
          }
          date._0_4_ = date._0_4_ + 1;
        }
        date._0_4_ = 0xe;
        while( true ) {
          bVar3 = false;
          if (date._0_4_ < 0x10) {
            UVar1 = ::U_SUCCESS(*status);
            bVar3 = UVar1 != '\0';
          }
          if (!bVar3) break;
          if (((ushort)text[date._0_4_] < 0x30) || (0x39 < (ushort)text[date._0_4_])) {
            local_70 = -1;
          }
          else {
            local_70 = (ushort)text[date._0_4_] - 0x30;
          }
          if (local_70 < 0) {
            *status = U_INVALID_FORMAT_ERROR;
          }
          else {
            idx = idx * 10 + local_70;
          }
          date._0_4_ = date._0_4_ + 1;
        }
      }
      UVar1 = ::U_SUCCESS(*status);
      if (UVar1 == '\0') {
        text_local = (UChar *)0x0;
      }
      else {
        dVar4 = Grego::fieldsToDay(day,hour + -1,min);
        text_local = (UChar *)(dVar4 * 86400000.0 + (double)(n * 3600000) + (double)(idx * 60000));
      }
    }
    else {
      *status = U_INVALID_FORMAT_ERROR;
      text_local = (UChar *)0x0;
    }
  }
  else {
    text_local = (UChar *)0x0;
  }
  return (UDate)text_local;
}

Assistant:

static UDate
parseDate (const UChar *text, UErrorCode &status) {
    if (U_FAILURE(status)) {
        return 0;
    }
    int32_t len = u_strlen(text);
    if (len != 16 && len != 10) {
        // It must be yyyy-MM-dd HH:mm (length 16) or yyyy-MM-dd (length 10)
        status = U_INVALID_FORMAT_ERROR;
        return 0;
    }

    int32_t year = 0, month = 0, day = 0, hour = 0, min = 0, n;
    int32_t idx;

    // "yyyy" (0 - 3)
    for (idx = 0; idx <= 3 && U_SUCCESS(status); idx++) {
        n = ASCII_DIGIT((int32_t)text[idx]);
        if (n >= 0) {
            year = 10*year + n;
        } else {
            status = U_INVALID_FORMAT_ERROR;
        }
    }
    // "MM" (5 - 6)
    for (idx = 5; idx <= 6 && U_SUCCESS(status); idx++) {
        n = ASCII_DIGIT((int32_t)text[idx]);
        if (n >= 0) {
            month = 10*month + n;
        } else {
            status = U_INVALID_FORMAT_ERROR;
        }
    }
    // "dd" (8 - 9)
    for (idx = 8; idx <= 9 && U_SUCCESS(status); idx++) {
        n = ASCII_DIGIT((int32_t)text[idx]);
        if (n >= 0) {
            day = 10*day + n;
        } else {
            status = U_INVALID_FORMAT_ERROR;
        }
    }
    if (len == 16) {
        // "HH" (11 - 12)
        for (idx = 11; idx <= 12 && U_SUCCESS(status); idx++) {
            n = ASCII_DIGIT((int32_t)text[idx]);
            if (n >= 0) {
                hour = 10*hour + n;
            } else {
                status = U_INVALID_FORMAT_ERROR;
            }
        }
        // "mm" (14 - 15)
        for (idx = 14; idx <= 15 && U_SUCCESS(status); idx++) {
            n = ASCII_DIGIT((int32_t)text[idx]);
            if (n >= 0) {
                min = 10*min + n;
            } else {
                status = U_INVALID_FORMAT_ERROR;
            }
        }
    }

    if (U_SUCCESS(status)) {
        UDate date = Grego::fieldsToDay(year, month - 1, day) * U_MILLIS_PER_DAY
            + hour * U_MILLIS_PER_HOUR + min * U_MILLIS_PER_MINUTE;
        return date;
    }
    return 0;
}